

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O3

void Imf_3_4::copyIntoFrameBuffer
               (char **readPtr,char *writePtr,char *endPtr,size_t xStride,bool fill,double fillValue
               ,Format format,PixelType typeInFrameBuffer,PixelType typeInFile)

{
  char cVar1;
  byte bVar2;
  ushort *puVar3;
  uint uVar4;
  size_t i;
  float *pfVar5;
  uint *puVar6;
  byte *pbVar7;
  uint16_t *puVar8;
  char *pcVar9;
  char *pcVar10;
  ArgExc *this;
  long lVar11;
  float fVar12;
  uint uVar13;
  half hVar14;
  undefined3 in_register_00000081;
  size_t __n;
  uchar b [4];
  float local_2c;
  
  if (CONCAT31(in_register_00000081,fill) == 0) {
    if (format == XDR) {
      if (typeInFrameBuffer == FLOAT) {
        if (typeInFile == UINT) {
          if (writePtr <= endPtr) {
            pcVar10 = *readPtr;
            do {
              lVar11 = 0;
              pcVar9 = pcVar10;
              do {
                pcVar10 = pcVar9 + 1;
                *readPtr = pcVar10;
                *(char *)((long)&local_2c + lVar11) = *pcVar9;
                lVar11 = lVar11 + 1;
                pcVar9 = pcVar10;
              } while ((int)lVar11 != 4);
              *(float *)writePtr = (float)(uint)local_2c;
              writePtr = (char *)((long)writePtr + xStride);
            } while (writePtr <= endPtr);
          }
        }
        else if (typeInFile == HALF) {
          if (writePtr <= endPtr) {
            pbVar7 = (byte *)(*readPtr + 1);
            do {
              *readPtr = (char *)pbVar7;
              bVar2 = pbVar7[-1];
              *readPtr = (char *)(pbVar7 + 1);
              *(undefined4 *)writePtr =
                   *(undefined4 *)
                    (_imath_half_to_float_table + (ulong)((uint)*pbVar7 * 0x400 + (uint)bVar2 * 4));
              writePtr = writePtr + xStride;
              pbVar7 = pbVar7 + 2;
            } while (writePtr <= endPtr);
          }
        }
        else {
          if (typeInFile != FLOAT) {
            this = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
            goto LAB_0018b895;
          }
          if (writePtr <= endPtr) {
            pcVar10 = *readPtr;
            do {
              lVar11 = 0;
              pcVar9 = pcVar10;
              do {
                pcVar10 = pcVar9 + 1;
                *readPtr = pcVar10;
                *(char *)((long)&local_2c + lVar11) = *pcVar9;
                lVar11 = lVar11 + 1;
                pcVar9 = pcVar10;
              } while ((int)lVar11 != 4);
              *(float *)writePtr = local_2c;
              writePtr = (char *)((long)writePtr + xStride);
            } while (writePtr <= endPtr);
          }
        }
      }
      else if (typeInFrameBuffer == HALF) {
        if (typeInFile == UINT) {
          for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
            lVar11 = 0;
            pcVar10 = *readPtr;
            do {
              *readPtr = pcVar10 + 1;
              *(char *)((long)&local_2c + lVar11) = *pcVar10;
              lVar11 = lVar11 + 1;
              pcVar10 = pcVar10 + 1;
            } while ((int)lVar11 != 4);
            hVar14 = uintToHalf((uint)local_2c);
            *(uint16_t *)writePtr = hVar14._h;
          }
        }
        else if (typeInFile == HALF) {
          if (writePtr <= endPtr) {
            pcVar10 = *readPtr + 1;
            do {
              *readPtr = pcVar10;
              cVar1 = pcVar10[-1];
              *readPtr = pcVar10 + 1;
              *(ushort *)writePtr = CONCAT11(*pcVar10,cVar1);
              writePtr = writePtr + xStride;
              pcVar10 = pcVar10 + 2;
            } while (writePtr <= endPtr);
          }
        }
        else {
          if (typeInFile != FLOAT) {
            this = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
            goto LAB_0018b895;
          }
          for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
            lVar11 = 0;
            pcVar10 = *readPtr;
            do {
              *readPtr = pcVar10 + 1;
              *(char *)((long)&local_2c + lVar11) = *pcVar10;
              lVar11 = lVar11 + 1;
              pcVar10 = pcVar10 + 1;
            } while ((int)lVar11 != 4);
            hVar14 = floatToHalf(local_2c);
            *(uint16_t *)writePtr = hVar14._h;
          }
        }
      }
      else {
        if (typeInFrameBuffer != UINT) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
LAB_0018b895:
          __cxa_throw(this,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        if (typeInFile == UINT) {
          if (writePtr <= endPtr) {
            pcVar10 = *readPtr;
            do {
              lVar11 = 0;
              pcVar9 = pcVar10;
              do {
                pcVar10 = pcVar9 + 1;
                *readPtr = pcVar10;
                *(char *)((long)&local_2c + lVar11) = *pcVar9;
                lVar11 = lVar11 + 1;
                pcVar9 = pcVar10;
              } while ((int)lVar11 != 4);
              *(float *)writePtr = local_2c;
              writePtr = (char *)((long)writePtr + xStride);
            } while (writePtr <= endPtr);
          }
        }
        else if (typeInFile == HALF) {
          for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
            pcVar10 = *readPtr;
            *readPtr = pcVar10 + 1;
            cVar1 = *pcVar10;
            *readPtr = pcVar10 + 2;
            hVar14._h._1_1_ = pcVar10[1];
            hVar14._h._0_1_ = cVar1;
            uVar4 = halfToUint(hVar14);
            *(uint *)writePtr = uVar4;
          }
        }
        else {
          if (typeInFile != FLOAT) {
            this = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
            goto LAB_0018b895;
          }
          for (; writePtr <= endPtr; writePtr = (char *)((long)writePtr + xStride)) {
            lVar11 = 0;
            pcVar10 = *readPtr;
            do {
              *readPtr = pcVar10 + 1;
              *(char *)((long)&local_2c + lVar11) = *pcVar10;
              lVar11 = lVar11 + 1;
              pcVar10 = pcVar10 + 1;
            } while ((int)lVar11 != 4);
            uVar4 = floatToUint(local_2c);
            *(uint *)writePtr = uVar4;
          }
        }
      }
    }
    else if (typeInFrameBuffer == FLOAT) {
      if (typeInFile == UINT) {
        if (writePtr <= endPtr) {
          puVar6 = (uint *)*readPtr;
          do {
            *(float *)writePtr = (float)*puVar6;
            *readPtr = (char *)(puVar6 + 1);
            writePtr = (char *)((long)writePtr + xStride);
            puVar6 = puVar6 + 1;
          } while (writePtr <= endPtr);
        }
      }
      else if (typeInFile == HALF) {
        if (writePtr <= endPtr) {
          puVar3 = (ushort *)*readPtr;
          do {
            *(undefined4 *)writePtr =
                 *(undefined4 *)(_imath_half_to_float_table + (ulong)*puVar3 * 4);
            *readPtr = (char *)(puVar3 + 1);
            writePtr = writePtr + xStride;
            puVar3 = puVar3 + 1;
          } while (writePtr <= endPtr);
        }
      }
      else {
        if (typeInFile != FLOAT) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
          goto LAB_0018b895;
        }
        for (; writePtr <= endPtr; writePtr = writePtr + xStride) {
          lVar11 = 0;
          do {
            writePtr[lVar11] = (*readPtr)[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          *readPtr = *readPtr + 4;
        }
      }
    }
    else if (typeInFrameBuffer == HALF) {
      if (typeInFile == UINT) {
        if (writePtr <= endPtr) {
          puVar6 = (uint *)*readPtr;
          do {
            hVar14 = uintToHalf(*puVar6);
            *(uint16_t *)writePtr = hVar14._h;
            puVar6 = (uint *)(*readPtr + 4);
            *readPtr = (char *)puVar6;
            writePtr = (char *)((long)writePtr + xStride);
          } while (writePtr <= endPtr);
        }
      }
      else if (typeInFile == HALF) {
        if (xStride == 2) {
          __n = (size_t)(((int)endPtr - (int)writePtr) + 2);
          memcpy(writePtr,*readPtr,__n);
          pcVar10 = *readPtr + __n;
        }
        else {
          if (endPtr < writePtr) {
            return;
          }
          pcVar10 = *readPtr;
          do {
            *(undefined2 *)writePtr = *(undefined2 *)pcVar10;
            pcVar10 = pcVar10 + 2;
            writePtr = writePtr + xStride;
          } while (writePtr <= endPtr);
        }
        *readPtr = pcVar10;
      }
      else {
        if (typeInFile != FLOAT) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
          goto LAB_0018b895;
        }
        if (writePtr <= endPtr) {
          pfVar5 = (float *)*readPtr;
          do {
            hVar14 = floatToHalf(*pfVar5);
            *(uint16_t *)writePtr = hVar14._h;
            pfVar5 = (float *)(*readPtr + 4);
            *readPtr = (char *)pfVar5;
            writePtr = (char *)((long)writePtr + xStride);
          } while (writePtr <= endPtr);
        }
      }
    }
    else {
      if (typeInFrameBuffer != UINT) {
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
        goto LAB_0018b895;
      }
      if (typeInFile == UINT) {
        for (; writePtr <= endPtr; writePtr = writePtr + xStride) {
          lVar11 = 0;
          do {
            writePtr[lVar11] = (*readPtr)[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          *readPtr = *readPtr + 4;
        }
      }
      else if (typeInFile == HALF) {
        if (writePtr <= endPtr) {
          puVar8 = (uint16_t *)*readPtr;
          do {
            uVar4 = halfToUint((half)*puVar8);
            *(uint *)writePtr = uVar4;
            puVar8 = (uint16_t *)(*readPtr + 2);
            *readPtr = (char *)puVar8;
            writePtr = (char *)((long)writePtr + xStride);
          } while (writePtr <= endPtr);
        }
      }
      else {
        if (typeInFile != FLOAT) {
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
          goto LAB_0018b895;
        }
        if (writePtr <= endPtr) {
          pfVar5 = (float *)*readPtr;
          do {
            uVar4 = floatToUint(*pfVar5);
            *(uint *)writePtr = uVar4;
            pfVar5 = (float *)(*readPtr + 4);
            *readPtr = (char *)pfVar5;
            writePtr = (char *)((long)writePtr + xStride);
          } while (writePtr <= endPtr);
        }
      }
    }
  }
  else if (typeInFrameBuffer == FLOAT) {
    if (writePtr <= endPtr) {
      do {
        *(float *)writePtr = (float)fillValue;
        writePtr = (char *)((long)writePtr + xStride);
      } while (writePtr <= endPtr);
    }
  }
  else if (typeInFrameBuffer == HALF) {
    fVar12 = ABS((float)fillValue);
    uVar4 = (uint)(float)fillValue >> 0x10 & 0x8000;
    if ((uint)fVar12 < 0x38800000) {
      if ((0x33000000 < (uint)fVar12) &&
         (uVar13 = (uint)fVar12 & 0x7fffff | 0x800000, cVar1 = (char)((uint)fVar12 >> 0x17),
         uVar4 = uVar4 | uVar13 >> (0x7eU - cVar1 & 0x1f),
         0x80000000 < uVar13 << (cVar1 + 0xa2U & 0x1f))) {
        uVar4 = uVar4 + 1;
      }
    }
    else if ((uint)fVar12 < 0x7f800000) {
      if ((uint)fVar12 < 0x477ff000) {
        uVar4 = (int)fVar12 + 0x8000fff + (uint)(((uint)fVar12 >> 0xd & 1) != 0) >> 0xd | uVar4;
      }
      else {
        uVar4 = uVar4 | 0x7c00;
      }
    }
    else {
      uVar4 = uVar4 | 0x7c00;
      if (fVar12 != INFINITY) {
        uVar13 = (uint)fVar12 >> 0xd & 0x3ff;
        uVar4 = uVar4 | uVar13 | (uint)(uVar13 == 0);
      }
    }
    for (; writePtr <= endPtr; writePtr = writePtr + xStride) {
      *(short *)writePtr = (short)uVar4;
    }
  }
  else {
    if (typeInFrameBuffer != UINT) {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this,"Unknown pixel data type.");
      goto LAB_0018b895;
    }
    if (writePtr <= endPtr) {
      do {
        *(int *)writePtr = (int)(long)fillValue;
        writePtr = writePtr + xStride;
      } while (writePtr <= endPtr);
    }
  }
  return;
}

Assistant:

void
copyIntoFrameBuffer (
    const char*&       readPtr,
    char*              writePtr,
    char*              endPtr,
    size_t             xStride,
    bool               fill,
    double             fillValue,
    Compressor::Format format,
    PixelType          typeInFrameBuffer,
    PixelType          typeInFile)
{
    //
    // Copy a horizontal row of pixels from an input
    // file's line or tile buffer to a frame buffer.
    //

    if (fill)
    {
        //
        // The file contains no data for this channel.
        // Store a default value in the frame buffer.
        //

        switch (typeInFrameBuffer)
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            {
                unsigned int fillVal = (unsigned int) (fillValue);

                while (writePtr <= endPtr)
                {
                    *(unsigned int*) writePtr = fillVal;
                    writePtr += xStride;
                }
            }
            break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            {
                half fillVal = half (fillValue);

                while (writePtr <= endPtr)
                {
                    *(half*) writePtr = fillVal;
                    writePtr += xStride;
                }
            }
            break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            {
                float fillVal = float (fillValue);

                while (writePtr <= endPtr)
                {
                    *(float*) writePtr = fillVal;
                    writePtr += xStride;
                }
            }
            break;

            default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else if (format == Compressor::XDR)
    {
        //
        // The line or tile buffer is in XDR format.
        //
        // Convert the pixels from the file's machine-
        // independent representation, and store the
        // results in the frame buffer.
        //

        switch (typeInFrameBuffer)
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            Xdr::read<CharPtrIO> (
                                readPtr, *(unsigned int*) writePtr);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            half h;
                            Xdr::read<CharPtrIO> (readPtr, h);
                            *(unsigned int*) writePtr = halfToUint (h);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            float f;
                            Xdr::read<CharPtrIO> (readPtr, f);
                            *(unsigned int*) writePtr = floatToUint (f);
                            writePtr += xStride;
                        }
                        break;

                    default:
                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            unsigned int ui;
                            Xdr::read<CharPtrIO> (readPtr, ui);
                            *(half*) writePtr = uintToHalf (ui);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            Xdr::read<CharPtrIO> (readPtr, *(half*) writePtr);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            float f;
                            Xdr::read<CharPtrIO> (readPtr, f);
                            *(half*) writePtr = floatToHalf (f);
                            writePtr += xStride;
                        }
                        break;
                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            unsigned int ui;
                            Xdr::read<CharPtrIO> (readPtr, ui);
                            *(float*) writePtr = float (ui);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            half h;
                            Xdr::read<CharPtrIO> (readPtr, h);
                            *(float*) writePtr = float (h);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            Xdr::read<CharPtrIO> (readPtr, *(float*) writePtr);
                            writePtr += xStride;
                        }
                        break;
                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else
    {
        //
        // The line or tile buffer is in NATIVE format.
        // Copy the results into the frame buffer.
        //

        switch (typeInFrameBuffer)
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            for (size_t i = 0; i < sizeof (unsigned int); ++i)
                                writePtr[i] = readPtr[i];

                            readPtr += sizeof (unsigned int);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            half h                    = *(half*) readPtr;
                            *(unsigned int*) writePtr = halfToUint (h);
                            readPtr += sizeof (half);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            float f;

                            for (size_t i = 0; i < sizeof (float); ++i)
                                ((char*) &f)[i] = readPtr[i];

                            *(unsigned int*) writePtr = floatToUint (f);
                            readPtr += sizeof (float);
                            writePtr += xStride;
                        }
                        break;

                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            unsigned int ui;

                            for (size_t i = 0; i < sizeof (unsigned int); ++i)
                                ((char*) &ui)[i] = readPtr[i];

                            *(half*) writePtr = uintToHalf (ui);
                            readPtr += sizeof (unsigned int);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        // If we're tightly packed, just memcpy
                        if (xStride == sizeof (half))
                        {
                            int numBytes = endPtr - writePtr + sizeof (half);
                            memcpy (writePtr, readPtr, numBytes);
                            readPtr += numBytes;
                            writePtr += numBytes;
                        }
                        else
                        {
                            while (writePtr <= endPtr)
                            {
                                *(half*) writePtr = *(half*) readPtr;
                                readPtr += sizeof (half);
                                writePtr += xStride;
                            }
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            float f;

                            for (size_t i = 0; i < sizeof (float); ++i)
                                ((char*) &f)[i] = readPtr[i];

                            *(half*) writePtr = floatToHalf (f);
                            readPtr += sizeof (float);
                            writePtr += xStride;
                        }
                        break;
                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                switch (typeInFile)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

                        while (writePtr <= endPtr)
                        {
                            unsigned int ui;

                            for (size_t i = 0; i < sizeof (unsigned int); ++i)
                                ((char*) &ui)[i] = readPtr[i];

                            *(float*) writePtr = float (ui);
                            readPtr += sizeof (unsigned int);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

                        while (writePtr <= endPtr)
                        {
                            half h             = *(half*) readPtr;
                            *(float*) writePtr = float (h);
                            readPtr += sizeof (half);
                            writePtr += xStride;
                        }
                        break;

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

                        while (writePtr <= endPtr)
                        {
                            for (size_t i = 0; i < sizeof (float); ++i)
                                writePtr[i] = readPtr[i];

                            readPtr += sizeof (float);
                            writePtr += xStride;
                        }
                        break;
                    default:

                        throw IEX_NAMESPACE::ArgExc (
                            "Unknown pixel data type.");
                }
                break;

            default: throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
}